

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_find.c
# Opt level: O3

mpt_node * mpt_node_find(mpt_node *parent,char *name,int pos)

{
  size_t sVar1;
  int *piVar2;
  mpt_node *pmVar3;
  size_t len;
  
  if ((parent == (mpt_node *)0x0) || (pmVar3 = parent->children, pmVar3 == (mpt_node *)0x0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    if (name == (char *)0x0) {
      len = 0;
    }
    else {
      sVar1 = strlen(name);
      len = (size_t)(int)sVar1;
    }
    if ((-1 < pos) || (pmVar3 = mpt_node_locate(pmVar3,0,name,len,-1), pmVar3 != (mpt_node *)0x0)) {
      pmVar3 = mpt_node_locate(pmVar3,pos,name,len,-1);
      return pmVar3;
    }
  }
  return (mpt_node *)0x0;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_find(const MPT_STRUCT(node) *parent, const char *name, int pos)
{
	MPT_STRUCT(node) *tmp;
	int idlen;
	
	if (!parent || !(tmp = parent->children)) {
		errno = EINVAL;
		return NULL;
	}
	idlen = name ? strlen(name) : 0;
	
	if (pos >= 0) {
		return mpt_node_locate(tmp, pos, name, idlen, -1);
	}
	if (!(tmp = mpt_node_locate(tmp, 0, name, idlen, -1))) {
		return 0;
	}
	return mpt_node_locate(tmp, pos, name, idlen, -1);
}